

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan
          (Registry *this,uint64_t aXpan,string *aName)

{
  Status SVar1;
  char cVar2;
  int iVar3;
  Domain dom;
  Network nwk;
  Domain DStack_a8;
  Network local_80;
  
  Network::Network(&local_80);
  Domain::Domain(&DStack_a8);
  SVar1 = GetNetworkByXpan(this,aXpan,&local_80);
  if (SVar1 == kSuccess) {
    iVar3 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                      (this->mStorage,&local_80.mDomainId,&DStack_a8);
    cVar2 = (char)iVar3;
    SVar1 = kNotFound;
    if (cVar2 != '\x01') {
      SVar1 = (cVar2 != '\0') << 2;
    }
    if (cVar2 == '\0') {
      std::__cxx11::string::_M_assign((string *)aName);
      SVar1 = kSuccess;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DStack_a8.mName._M_dataplus._M_p != &DStack_a8.mName.field_2) {
    operator_delete(DStack_a8.mName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mMlp._M_dataplus._M_p != &local_80.mMlp.field_2) {
    operator_delete(local_80.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mName._M_dataplus._M_p != &local_80.mName.field_2) {
    operator_delete(local_80.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetDomainNameByXpan(uint64_t aXpan, std::string &aName)
{
    Registry::Status status;
    Network          nwk;
    Domain           dom;

    VerifyOrExit(Registry::Status::kSuccess == (status = GetNetworkByXpan(aXpan, nwk)));
    VerifyOrExit(Registry::Status::kSuccess == (status = MapStatus(mStorage->Get(nwk.mDomainId, dom))));
    aName = dom.mName;
exit:
    return status;
}